

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManTransferTiming(Gia_Man_t *p,Gia_Man_t *pGia)

{
  Vec_Flt_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  char *pcVar3;
  float fVar4;
  Vec_Int_t *pVVar5;
  
  pVVar5 = pGia->vCoReqs;
  if (pVVar5 == (Vec_Int_t *)0x0 && pGia->vCiArrs == (Vec_Int_t *)0x0) {
    if ((pGia->vCoArrs == (Vec_Int_t *)0x0) && (pGia->vCoAttrs == (Vec_Int_t *)0x0))
    goto LAB_002155ab;
    pVVar5 = (Vec_Int_t *)0x0;
  }
  p->vCiArrs = pGia->vCiArrs;
  pGia->vCiArrs = (Vec_Int_t *)0x0;
  p->vCoReqs = pVVar5;
  pGia->vCoReqs = (Vec_Int_t *)0x0;
  pVVar5 = pGia->vCoAttrs;
  p->vCoArrs = pGia->vCoArrs;
  p->vCoAttrs = pVVar5;
  pGia->vCoArrs = (Vec_Int_t *)0x0;
  pGia->vCoAttrs = (Vec_Int_t *)0x0;
  p->And2Delay = pGia->And2Delay;
LAB_002155ab:
  pVVar1 = pGia->vOutReqs;
  if (pGia->vInArrs != (Vec_Flt_t *)0x0 || pVVar1 != (Vec_Flt_t *)0x0) {
    p->vInArrs = pGia->vInArrs;
    pGia->vInArrs = (Vec_Flt_t *)0x0;
    p->vOutReqs = pVVar1;
    pGia->vOutReqs = (Vec_Flt_t *)0x0;
    fVar4 = pGia->DefOutReqs;
    p->DefInArrs = pGia->DefInArrs;
    p->DefOutReqs = fVar4;
    p->And2Delay = pGia->And2Delay;
  }
  pVVar2 = pGia->vNamesOut;
  if (pGia->vNamesIn != (Vec_Ptr_t *)0x0 || pVVar2 != (Vec_Ptr_t *)0x0) {
    p->vNamesIn = pGia->vNamesIn;
    pGia->vNamesIn = (Vec_Ptr_t *)0x0;
    p->vNamesOut = pVVar2;
    pGia->vNamesOut = (Vec_Ptr_t *)0x0;
  }
  pcVar3 = pGia->pCellStr;
  if (pGia->vConfigs != (Vec_Int_t *)0x0 || pcVar3 != (char *)0x0) {
    p->vConfigs = pGia->vConfigs;
    pGia->vConfigs = (Vec_Int_t *)0x0;
    p->pCellStr = pcVar3;
    pGia->pCellStr = (char *)0x0;
  }
  if (p != pGia && pGia->pManTime != (void *)0x0) {
    p->pManTime = pGia->pManTime;
    pGia->pManTime = (void *)0x0;
    p->pAigExtra = pGia->pAigExtra;
    pGia->pAigExtra = (Gia_Man_t *)0x0;
    pVVar5 = pGia->vRegInits;
    p->vRegClasses = pGia->vRegClasses;
    p->vRegInits = pVVar5;
    pGia->vRegClasses = (Vec_Int_t *)0x0;
    pGia->vRegInits = (Vec_Int_t *)0x0;
    p->nAnd2Delay = pGia->nAnd2Delay;
    pGia->nAnd2Delay = 0;
  }
  return;
}

Assistant:

void Gia_ManTransferTiming( Gia_Man_t * p, Gia_Man_t * pGia )
{
    if ( pGia->vCiArrs || pGia->vCoReqs || pGia->vCoArrs || pGia->vCoAttrs )
    {
        p->vCiArrs     = pGia->vCiArrs;     pGia->vCiArrs    = NULL;
        p->vCoReqs     = pGia->vCoReqs;     pGia->vCoReqs    = NULL;
        p->vCoArrs     = pGia->vCoArrs;     pGia->vCoArrs    = NULL;
        p->vCoAttrs    = pGia->vCoAttrs;    pGia->vCoAttrs   = NULL;
        p->And2Delay   = pGia->And2Delay;
    }
    if ( pGia->vInArrs || pGia->vOutReqs )
    {
        p->vInArrs     = pGia->vInArrs;     pGia->vInArrs     = NULL;
        p->vOutReqs    = pGia->vOutReqs;    pGia->vOutReqs    = NULL;
        p->DefInArrs   = pGia->DefInArrs;
        p->DefOutReqs  = pGia->DefOutReqs;
        p->And2Delay   = pGia->And2Delay;
    }
    if ( pGia->vNamesIn || pGia->vNamesOut )
    {
        p->vNamesIn     = pGia->vNamesIn;     pGia->vNamesIn     = NULL;
        p->vNamesOut    = pGia->vNamesOut;    pGia->vNamesOut    = NULL;
    }
    if ( pGia->vConfigs || pGia->pCellStr )
    {
        p->vConfigs     = pGia->vConfigs;     pGia->vConfigs     = NULL;
        p->pCellStr     = pGia->pCellStr;     pGia->pCellStr     = NULL;
    }
    if ( pGia->pManTime == NULL || p == pGia )
        return;
    p->pManTime    = pGia->pManTime;    pGia->pManTime    = NULL;
    p->pAigExtra   = pGia->pAigExtra;   pGia->pAigExtra   = NULL;
    p->vRegClasses = pGia->vRegClasses; pGia->vRegClasses = NULL;
    p->vRegInits   = pGia->vRegInits;   pGia->vRegInits = NULL;
    p->nAnd2Delay  = pGia->nAnd2Delay;  pGia->nAnd2Delay  = 0;
}